

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O3

void xLearn::pred_thread(DMatrix *matrix,Model *model,vector<float,_std::allocator<float>_> *pred,
                        Score *score_func_,bool is_norm,size_t start_idx,size_t end_idx)

{
  ostream *poVar1;
  size_t i;
  float fVar2;
  Logger local_74;
  string local_70;
  string local_50;
  
  if (end_idx < start_idx) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_74.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/loss.cc"
               ,"");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"pred_thread","");
    poVar1 = Logger::Start(ERR,&local_50,0x2a,&local_70);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK_GE failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/loss.cc"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x2a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"end_idx",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"start_idx",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    Logger::~Logger(&local_74);
    abort();
  }
  if (start_idx < end_idx) {
    do {
      fVar2 = 1.0;
      if (is_norm) {
        fVar2 = (matrix->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[start_idx];
      }
      (*score_func_->_vptr_Score[3])
                (score_func_,
                 (matrix->row).
                 super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[start_idx],model);
      (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start[start_idx] = fVar2;
      start_idx = start_idx + 1;
    } while (end_idx != start_idx);
  }
  return;
}

Assistant:

void pred_thread(const DMatrix* matrix,
                 Model* model,
                 std::vector<real_t>* pred,
                 Score* score_func_,
                 bool is_norm,
                 size_t start_idx,
                 size_t end_idx) {
  CHECK_GE(end_idx, start_idx);
  for (size_t i = start_idx; i < end_idx; ++i) {
    SparseRow* row = matrix->row[i];
    real_t norm = is_norm ? matrix->norm[i] : 1.0;
    (*pred)[i] = score_func_->CalcScore(row, *model, norm);
  }
}